

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int btreeOverwriteOverflowCell(BtCursor *pCur,BtreePayload *pX)

{
  MemPage *pMVar1;
  BtShared *pBt;
  int iVar2;
  int iVar3;
  int iVar4;
  u8 *p;
  uint uVar5;
  ulong uVar6;
  MemPage *pPage;
  Pgno local_44;
  MemPage *local_40;
  BtreePayload *local_38;
  
  uVar5 = pX->nZero + pX->nData;
  pMVar1 = pCur->pPage;
  local_40 = pMVar1;
  iVar2 = btreeOverwriteContent(pMVar1,(pCur->info).pPayload,pX,0,(uint)(pCur->info).nLocal);
  if (iVar2 == 0) {
    uVar6 = (ulong)(pCur->info).nLocal;
    local_38 = pX;
    local_44 = sqlite3Get4byte((pCur->info).pPayload + uVar6);
    pBt = pMVar1->pBt;
    iVar2 = pBt->usableSize - 4;
    do {
      iVar3 = btreeGetPage(pBt,local_44,&local_40,0);
      pMVar1 = local_40;
      if (iVar3 != 0) {
        return iVar3;
      }
      iVar3 = (int)uVar6;
      if (((int)local_40->pDbPage->nRef == 1) && (local_40->isInit == '\0')) {
        if ((uint)(iVar2 + iVar3) < uVar5) {
          p = local_40->aData;
          local_44 = sqlite3Get4byte(p);
        }
        else {
          iVar2 = uVar5 - iVar3;
          p = local_40->aData;
        }
        iVar4 = btreeOverwriteContent(pMVar1,p + 4,local_38,iVar3,iVar2);
      }
      else {
        iVar4 = sqlite3CorruptError(0x13796);
      }
      sqlite3PagerUnref(pMVar1->pDbPage);
      if (iVar4 != 0) {
        return iVar4;
      }
      uVar6 = (ulong)(uint)(iVar3 + iVar2);
    } while (iVar3 + iVar2 < (int)uVar5);
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

static SQLITE_NOINLINE int btreeOverwriteOverflowCell(
  BtCursor *pCur,                     /* Cursor pointing to cell to overwrite */
  const BtreePayload *pX              /* Content to write into the cell */
){
  int iOffset;                        /* Next byte of pX->pData to write */
  int nTotal = pX->nData + pX->nZero; /* Total bytes of to write */
  int rc;                             /* Return code */
  MemPage *pPage = pCur->pPage;       /* Page being written */
  BtShared *pBt;                      /* Btree */
  Pgno ovflPgno;                      /* Next overflow page to write */
  u32 ovflPageSize;                   /* Size to write on overflow page */

  assert( pCur->info.nLocal<nTotal );  /* pCur is an overflow cell */

  /* Overwrite the local portion first */
  rc = btreeOverwriteContent(pPage, pCur->info.pPayload, pX,
                             0, pCur->info.nLocal);
  if( rc ) return rc;

  /* Now overwrite the overflow pages */
  iOffset = pCur->info.nLocal;
  assert( nTotal>=0 );
  assert( iOffset>=0 );
  ovflPgno = get4byte(pCur->info.pPayload + iOffset);
  pBt = pPage->pBt;
  ovflPageSize = pBt->usableSize - 4;
  do{
    rc = btreeGetPage(pBt, ovflPgno, &pPage, 0);
    if( rc ) return rc;
    if( sqlite3PagerPageRefcount(pPage->pDbPage)!=1 || pPage->isInit ){
      rc = SQLITE_CORRUPT_PAGE(pPage);
    }else{
      if( iOffset+ovflPageSize<(u32)nTotal ){
        ovflPgno = get4byte(pPage->aData);
      }else{
        ovflPageSize = nTotal - iOffset;
      }
      rc = btreeOverwriteContent(pPage, pPage->aData+4, pX,
                                 iOffset, ovflPageSize);
    }
    sqlite3PagerUnref(pPage->pDbPage);
    if( rc ) return rc;
    iOffset += ovflPageSize;
  }while( iOffset<nTotal );
  return SQLITE_OK;
}